

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SSAPropagator::IsPhiArgExecutable(SSAPropagator *this,Instruction *phi,uint32_t i)

{
  bool bVar1;
  uint32_t id;
  BasicBlock *b2;
  DefUseManager *this_00;
  Instruction *instr;
  BasicBlock *b1;
  Edge local_30;
  
  b2 = IRContext::get_instr_block(this->ctx_,phi);
  id = Instruction::GetSingleWordOperand(phi,i + 1);
  this_00 = get_def_use_mgr(this);
  instr = analysis::DefUseManager::GetDef(this_00,id);
  b1 = IRContext::get_instr_block(this->ctx_,instr);
  Edge::Edge(&local_30,b1,b2);
  bVar1 = IsEdgeExecutable(this,&local_30);
  return bVar1;
}

Assistant:

bool SSAPropagator::IsPhiArgExecutable(Instruction* phi, uint32_t i) const {
  BasicBlock* phi_bb = ctx_->get_instr_block(phi);

  uint32_t in_label_id = phi->GetSingleWordOperand(i + 1);
  Instruction* in_label_instr = get_def_use_mgr()->GetDef(in_label_id);
  BasicBlock* in_bb = ctx_->get_instr_block(in_label_instr);

  return IsEdgeExecutable(Edge(in_bb, phi_bb));
}